

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler.cc
# Opt level: O1

void prometheus::detail::MetricsHandler::CleanupStalePointers
               (vector<std::weak_ptr<prometheus::Collectable>,_std::allocator<std::weak_ptr<prometheus::Collectable>_>_>
                *collectables)

{
  __weak_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  __weak_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2> *p_Var3;
  long lVar4;
  iterator __first;
  
  p_Var3 = &((collectables->
             super__Vector_base<std::weak_ptr<prometheus::Collectable>,_std::allocator<std::weak_ptr<prometheus::Collectable>_>_>
             )._M_impl.super__Vector_impl_data._M_start)->
            super___weak_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2>;
  p_Var1 = &((collectables->
             super__Vector_base<std::weak_ptr<prometheus::Collectable>,_std::allocator<std::weak_ptr<prometheus::Collectable>_>_>
             )._M_impl.super__Vector_impl_data._M_finish)->
            super___weak_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2>;
  lVar4 = (long)p_Var1 - (long)p_Var3 >> 6;
  if (0 < lVar4) {
    lVar4 = lVar4 + 1;
    p_Var3 = p_Var3 + 2;
    do {
      __first._M_current = (weak_ptr<prometheus::Collectable> *)p_Var3;
      p_Var2 = (&(__first._M_current)->
                 super___weak_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2>)[-2].
               _M_refcount._M_pi;
      if ((p_Var2 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
         (p_Var2->_M_use_count == 0)) {
        __first._M_current =
             (weak_ptr<prometheus::Collectable> *)
             (&(__first._M_current)->
               super___weak_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2> + -2);
        goto LAB_00129d97;
      }
      p_Var2 = (&(__first._M_current)->
                 super___weak_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2>)[-1].
               _M_refcount._M_pi;
      if ((p_Var2 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
         (p_Var2->_M_use_count == 0)) {
        __first._M_current =
             (weak_ptr<prometheus::Collectable> *)
             (&(__first._M_current)->
               super___weak_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2> + -1);
        goto LAB_00129d97;
      }
      p_Var2 = ((__first._M_current)->
               super___weak_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
               _M_pi;
      if ((p_Var2 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
         (p_Var2->_M_use_count == 0)) goto LAB_00129d97;
      p_Var2 = (&(__first._M_current)->
                 super___weak_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2>)[1].
               _M_refcount._M_pi;
      if ((p_Var2 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
         (p_Var2->_M_use_count == 0)) {
        __first._M_current =
             (weak_ptr<prometheus::Collectable> *)
             (&(__first._M_current)->
               super___weak_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2> + 1);
        goto LAB_00129d97;
      }
      lVar4 = lVar4 + -1;
      p_Var3 = &(__first._M_current)->
                super___weak_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2> + 4;
    } while (1 < lVar4);
    p_Var3 = &(__first._M_current)->
              super___weak_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2> + 2;
  }
  lVar4 = (long)p_Var1 - (long)p_Var3 >> 4;
  if (lVar4 != 1) {
    if (lVar4 != 2) {
      __first._M_current = (weak_ptr<prometheus::Collectable> *)p_Var1;
      if (((lVar4 != 3) ||
          (p_Var2 = (p_Var3->_M_refcount)._M_pi,
          __first._M_current = (weak_ptr<prometheus::Collectable> *)p_Var3,
          p_Var2 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) ||
         (p_Var2->_M_use_count == 0)) goto LAB_00129d97;
      p_Var3 = p_Var3 + 1;
    }
    p_Var2 = (p_Var3->_M_refcount)._M_pi;
    __first._M_current = (weak_ptr<prometheus::Collectable> *)p_Var3;
    if ((p_Var2 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
       (p_Var2->_M_use_count == 0)) goto LAB_00129d97;
    p_Var3 = p_Var3 + 1;
  }
  p_Var2 = (p_Var3->_M_refcount)._M_pi;
  __first._M_current = (weak_ptr<prometheus::Collectable> *)p_Var3;
  if ((p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) && (p_Var2->_M_use_count != 0)
     ) {
    __first._M_current = (weak_ptr<prometheus::Collectable> *)p_Var1;
  }
LAB_00129d97:
  p_Var3 = &(__first._M_current)->
            super___weak_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2> + 1;
  if (p_Var3 != p_Var1 &&
      &(__first._M_current)->super___weak_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2>
      != p_Var1) {
    do {
      p_Var2 = (p_Var3->_M_refcount)._M_pi;
      if ((p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
         (p_Var2->_M_use_count != 0)) {
        std::__weak_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (&(__first._M_current)->
                    super___weak_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2>,p_Var3);
        __first._M_current =
             (weak_ptr<prometheus::Collectable> *)
             (&(__first._M_current)->
               super___weak_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2> + 1);
      }
      p_Var3 = p_Var3 + 1;
    } while (p_Var3 != p_Var1);
  }
  std::
  vector<std::weak_ptr<prometheus::Collectable>,_std::allocator<std::weak_ptr<prometheus::Collectable>_>_>
  ::_M_erase(collectables,__first,
             (collectables->
             super__Vector_base<std::weak_ptr<prometheus::Collectable>,_std::allocator<std::weak_ptr<prometheus::Collectable>_>_>
             )._M_impl.super__Vector_impl_data._M_finish);
  return;
}

Assistant:

void MetricsHandler::CleanupStalePointers(
    std::vector<std::weak_ptr<Collectable>>& collectables) {
  collectables.erase(
      std::remove_if(std::begin(collectables), std::end(collectables),
                     [](const std::weak_ptr<Collectable>& candidate) {
                       return candidate.expired();
                     }),
      std::end(collectables));
}